

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushOverrideID(ImGuiID id)

{
  ImGuiWindow *window;
  ImGuiID id_local;
  
  window._4_4_ = id;
  ImVector<unsigned_int>::push_back(&GImGui->CurrentWindow->IDStack,(uint *)((long)&window + 4));
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    window->IDStack.push_back(id);
}